

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetOrthAA(void *kinmem,int orthaa)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0xb7;
  }
  else {
    if ((uint)orthaa < 4) {
      *(int *)((long)kinmem + 0x1d0) = orthaa;
      return 0;
    }
    msgfmt = "Illegal value for orthaa.";
    iVar1 = -2;
    error_code = -2;
    line = 0xbf;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetOrthAA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetOrthAA(void* kinmem, int orthaa)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if ((orthaa < KIN_ORTH_MGS) || (orthaa > KIN_ORTH_DCGS2))
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ORTHAA);
    return (KIN_ILL_INPUT);
  }

  kin_mem->kin_orth_aa = orthaa;

  return (KIN_SUCCESS);
}